

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulate.cc
# Opt level: O3

bool sfm::is_consistent_pose(Correspondence2D2D *match,CameraPose *pose1,CameraPose *pose2)

{
  Matrix<double,_3,_3> *pMVar1;
  int i;
  long lVar2;
  long lVar3;
  double dVar4;
  undefined1 local_60 [8];
  Vector<double,_3> x;
  Vector<double,_3> ret;
  Vector<double,_3> ret_1;
  
  triangulate_match((Vector<double,_3> *)local_60,match,pose1,pose2);
  pMVar1 = &pose1->R;
  lVar2 = 0;
  do {
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)pMVar1->m + lVar3) * *(double *)((long)x.v + lVar3 + -8);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    x.v[lVar2 + 2] = dVar4;
    lVar2 = lVar2 + 1;
    pMVar1 = (Matrix<double,_3,_3> *)(pMVar1->m + 3);
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    *(double *)((long)x.v + lVar2 + 0x10) =
         *(double *)((long)x.v + lVar2 + 0x10) + *(double *)((long)(pose1->t).v + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  pMVar1 = &pose2->R;
  lVar2 = 0;
  do {
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)pMVar1->m + lVar3) * *(double *)((long)x.v + lVar3 + -8);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    ret.v[lVar2 + 2] = dVar4;
    lVar2 = lVar2 + 1;
    pMVar1 = (Matrix<double,_3,_3> *)(pMVar1->m + 3);
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    *(double *)((long)ret.v + lVar2 + 0x10) =
         *(double *)((long)ret.v + lVar2 + 0x10) + *(double *)((long)(pose2->t).v + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  return (bool)(-(0.0 < ret_1.v[1]) & -(0.0 < ret.v[1]) & 1);
}

Assistant:

bool
is_consistent_pose (Correspondence2D2D const& match,
    CameraPose const& pose1, CameraPose const& pose2)
{
    math::Vector<double, 3> x = triangulate_match(match, pose1, pose2);
    math::Vector<double, 3> x1 = pose1.R * x + pose1.t;
    math::Vector<double, 3> x2 = pose2.R * x + pose2.t;
    return x1[2] > 0.0f && x2[2] > 0.0f;
}